

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::TrimCapabilitiesPass::Process(TrimCapabilitiesPass *this)

{
  bool bVar1;
  Status SVar2;
  Status SVar3;
  pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_> local_60;
  
  bVar1 = HasForbiddenCapabilities(this);
  if (bVar1) {
    SVar2 = SuccessWithoutChange;
  }
  else {
    DetermineRequiredCapabilitiesAndExtensions(&local_60,this);
    SVar2 = TrimUnrequiredCapabilities(this,&local_60.first);
    SVar3 = TrimUnrequiredExtensions(this,&local_60.second);
    SVar2 = (SVar3 == SuccessWithChange || SVar2 == SuccessWithChange) ^ SuccessWithoutChange;
    std::pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_>::~pair
              (&local_60);
  }
  return SVar2;
}

Assistant:

Pass::Status TrimCapabilitiesPass::Process() {
  if (HasForbiddenCapabilities()) {
    return Status::SuccessWithoutChange;
  }

  auto[required_capabilities, required_extensions] =
      DetermineRequiredCapabilitiesAndExtensions();

  Pass::Status capStatus = TrimUnrequiredCapabilities(required_capabilities);
  Pass::Status extStatus = TrimUnrequiredExtensions(required_extensions);

  return capStatus == Pass::Status::SuccessWithChange ||
                 extStatus == Pass::Status::SuccessWithChange
             ? Pass::Status::SuccessWithChange
             : Pass::Status::SuccessWithoutChange;
}